

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

void uv__process_child_init
               (uv_process_options_t *options,int *error_fd,int stdio_count,int (*pipes) [2])

{
  int iVar1;
  uint __fd;
  int extraout_EAX;
  __sighandler_t p_Var2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  uint *puVar7;
  ulong uVar8;
  char **__envp;
  char **ppcVar9;
  char *__s;
  char *pcVar10;
  uint uVar11;
  char **env_iterator;
  char **ppcVar12;
  char **__n;
  char **ppcStack_1270;
  cpu_set_t cpuset;
  sigset_t signewset;
  char local_1138 [4360];
  
  ppcVar9 = (char **)(ulong)(uint)stdio_count;
  ppcStack_1270 = (char **)0x1;
  do {
    iVar1 = (int)ppcStack_1270;
    if ((iVar1 != 9) && (iVar1 != 0x13)) {
      if (iVar1 == 0x20) {
        if ((options->flags & 8) != 0) {
          setsid();
        }
        ppcStack_1270 = (char **)0x0;
        if (0 < stdio_count) {
          ppcStack_1270 = (char **)(ulong)(uint)stdio_count;
        }
        ppcVar12 = (char **)0x0;
        break;
      }
      p_Var2 = signal(iVar1,(__sighandler_t)0x0);
      if (p_Var2 == (__sighandler_t)0xffffffffffffffff) goto LAB_001b8ba6;
    }
    ppcStack_1270 = (char **)(ulong)(iVar1 + 1);
  } while( true );
LAB_001b8b7a:
  if (ppcStack_1270 == ppcVar12) goto LAB_001b8bae;
  if ((char **)(ulong)(uint)pipes[(long)ppcVar12][1] < ppcVar12) {
    iVar1 = fcntl64((char **)(ulong)(uint)pipes[(long)ppcVar12][1],0x406,ppcVar9);
    pipes[(long)ppcVar12][1] = iVar1;
    if (iVar1 == -1) goto LAB_001b8ba6;
  }
  ppcVar12 = (char **)((long)ppcVar12 + 1);
  goto LAB_001b8b7a;
LAB_001b8ba6:
  uv__write_errno(error_fd);
LAB_001b8bae:
  __s = "/dev/null";
  for (uVar11 = 0; (int)uVar11 < stdio_count; uVar11 = uVar11 + 1) {
    __fd = pipes[(int)uVar11][1];
    if ((int)__fd < 0) {
      if ((int)uVar11 < 3) {
        uv__close_nocheckstdio(uVar11);
        __fd = open64("/dev/null",(uint)(uVar11 != 0) * 2);
        if (-1 < (int)__fd) {
          ppcStack_1270 = (char **)(ulong)__fd;
          if (uVar11 != __fd) goto LAB_001b8c32;
          ppcStack_1270 = (char **)(ulong)uVar11;
          goto LAB_001b8c5e;
        }
        goto LAB_001b8d2d;
      }
    }
    else {
      ppcStack_1270 = (char **)0xffffffff;
      if (uVar11 == __fd) {
        iVar1 = uv__cloexec(uVar11,0);
        ppcStack_1270 = (char **)0xffffffff;
        if (iVar1 != 0) goto LAB_001b8d37;
      }
      else {
LAB_001b8c32:
        uVar11 = dup2(__fd,uVar11);
        if (uVar11 == 0xffffffff) goto LAB_001b8d2d;
      }
      if (((int)ppcStack_1270 == -1) && ((int)uVar11 < 3)) {
        uv__nonblock_fcntl(uVar11,0);
        ppcStack_1270 = (char **)0xffffffff;
      }
LAB_001b8c5e:
      if (stdio_count <= (int)ppcStack_1270) {
        uv__close((int)ppcStack_1270);
      }
    }
  }
  if ((options->cwd != (char *)0x0) && (iVar1 = chdir(options->cwd), iVar1 != 0)) {
LAB_001b8d2d:
    uv__write_errno(error_fd);
    iVar1 = extraout_EAX;
LAB_001b8d37:
    *error_fd = iVar1;
    _exit(0x7f);
  }
  uVar11 = options->flags;
  if ((uVar11 & 3) != 0) {
    ppcStack_1270 = (char **)__errno_location();
    uVar11 = *(uint *)ppcStack_1270;
    ppcVar9 = (char **)(ulong)uVar11;
    setgroups(0,(__gid_t *)0x0);
    *(uint *)ppcStack_1270 = uVar11;
    uVar11 = options->flags;
  }
  if ((uVar11 & 2) != 0) {
    iVar1 = setgid(options->gid);
    if (iVar1 != 0) goto LAB_001b8e3f;
    uVar11 = options->flags;
  }
  if (((uVar11 & 1) == 0) || (iVar1 = setuid(options->uid), iVar1 == 0)) {
    if (options->cpumask != (char *)0x0) {
      uVar11 = uv_cpumask_size();
      if (options->cpumask_size < (ulong)(long)(int)uVar11) {
        __assert_fail("options->cpumask_size >= (size_t)cpumask_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                      ,0x221,
                      "void uv__process_child_init(const uv_process_options_t *, volatile int *, int, int (*)[2])"
                     );
      }
      cpuset.__bits[0xe] = 0;
      cpuset.__bits[0xf] = 0;
      cpuset.__bits[0xc] = 0;
      cpuset.__bits[0xd] = 0;
      cpuset.__bits[10] = 0;
      cpuset.__bits[0xb] = 0;
      cpuset.__bits[8] = 0;
      cpuset.__bits[9] = 0;
      cpuset.__bits[6] = 0;
      cpuset.__bits[7] = 0;
      cpuset.__bits[4] = 0;
      cpuset.__bits[5] = 0;
      cpuset.__bits[2] = 0;
      cpuset.__bits[3] = 0;
      cpuset.__bits[0] = 0;
      cpuset.__bits[1] = 0;
      uVar8 = 0;
      uVar3 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar3 = uVar8;
      }
      for (; uVar3 != uVar8; uVar8 = uVar8 + 1) {
        if ((uVar8 < 0x400) && (options->cpumask[uVar8] != '\0')) {
          cpuset.__bits[uVar8 >> 6] = cpuset.__bits[uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
        }
      }
      iVar1 = sched_setaffinity(0,0x80,(cpu_set_t *)&cpuset);
      if (iVar1 != 0) goto LAB_001b8e3f;
    }
    sigemptyset((sigset_t *)&signewset);
    iVar1 = sigprocmask(2,(sigset_t *)&signewset,(sigset_t *)0x0);
    if (iVar1 != 0) {
      abort();
    }
    ppcVar9 = options->env;
    __s = options->file;
    ppcStack_1270 = options->args;
    if (ppcVar9 == (char **)0x0) {
      execvp(__s,ppcStack_1270);
    }
    else if (__s != (char *)0x0) {
      pcVar4 = strchr(__s,0x2f);
      if (pcVar4 == (char *)0x0) {
        ppcVar12 = ppcStack_1270;
        __envp = ppcVar9;
        pcVar4 = __s;
        if (_environ != ppcVar9) goto LAB_001b8e47;
        execvpe(__s,ppcStack_1270,ppcVar9);
      }
      else {
        execve(__s,ppcStack_1270,ppcVar9);
      }
    }
  }
LAB_001b8e3f:
  do {
    uv__write_errno(error_fd);
    ppcVar12 = ppcStack_1270;
    __envp = ppcVar9;
    pcVar4 = __s;
LAB_001b8e47:
    __s = (char *)0x0;
    ppcStack_1270 = (char **)0x1d3027;
    ppcVar9 = __envp;
    do {
      pcVar10 = *ppcVar9;
      if (pcVar10 == (char *)0x0) goto LAB_001b8e88;
      iVar1 = strncmp(pcVar10,"PATH=",5);
      ppcVar9 = ppcVar9 + 1;
    } while (iVar1 != 0);
    __s = pcVar10 + 5;
LAB_001b8e88:
    sVar5 = strnlen(pcVar4,0x100);
    ppcVar9 = __envp;
  } while (0xff < sVar5);
  pcVar10 = "/usr/bin:/bin";
  if (__s != (char *)0x0) {
    pcVar10 = __s;
  }
  sVar6 = strnlen(pcVar10,0xfff);
  ppcVar9 = (char **)(sVar6 + 1);
  ppcStack_1270 = (char **)0x3a;
  do {
    __s = strchr(pcVar10,0x3a);
    if (__s == (char *)0x0) {
      sVar6 = strlen(pcVar10);
      __s = pcVar10 + sVar6;
    }
    __n = (char **)(__s + -(long)pcVar10);
    if (__n < ppcVar9) {
      memcpy(local_1138,pcVar10,(size_t)__n);
      local_1138[(long)__n] = '/';
      memcpy((char *)((long)__n + (long)local_1138) + (pcVar10 < __s),pcVar4,sVar5 + 1);
      execve(local_1138,ppcVar12,__envp);
      puVar7 = (uint *)__errno_location();
      if ((0x14 < *puVar7) || ((0x102004U >> (*puVar7 & 0x1f) & 1) == 0)) goto LAB_001b8e3f;
    }
    if (*__s == '\0') goto LAB_001b8e3f;
    pcVar10 = __s + 1;
  } while( true );
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
#ifdef __linux__
                                   volatile int* error_fd,
#else
                                   int error_fd,
#endif
                                   int stdio_count,
                                   int (*pipes)[2]) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;
#if defined(__linux__) || defined(__FreeBSD__)
  int i;
  int cpumask_size;
  uv__cpu_set_t cpuset;
#endif

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

#if defined(__linux__) || defined(__FreeBSD__)
  if (options->cpumask != NULL) {
    cpumask_size = uv_cpumask_size();
    assert(options->cpumask_size >= (size_t)cpumask_size);

    CPU_ZERO(&cpuset);
    for (i = 0; i < cpumask_size; ++i) {
      if (options->cpumask[i]) {
        CPU_SET(i, &cpuset);
      }
    }

#if defined(__linux__)
    /* Avoid using pthread calls when using vfork. */
    if (sched_setaffinity(0, sizeof(cpuset), &cpuset))
      uv__write_errno(error_fd);
#else
    n = pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
    if (n)
      uv__write_int(error_fd, UV__ERR(n));
#endif
  }
#endif

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __linux__
  if (options->env != NULL) {
    uv__execvpe(options->file, options->args, options->env);
  } else {
    execvp(options->file, options->args);
  }
#else
  if (options->env != NULL) {
    environ = options->env;
  }

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif
#endif

  uv__write_errno(error_fd);
}